

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createPipeline
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ProgramParams *pp)

{
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_00;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_01;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_02;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_03;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *paVar2;
  undefined4 seed;
  bool bVar3;
  deUint32 dVar4;
  char *pcVar5;
  ProgramPipeline *pPVar6;
  ProgramWrapper *pPVar7;
  TestLog *this_00;
  MessageBuilder *pMVar8;
  TestLog *this_01;
  TestLog *this_02;
  TestLog *this_03;
  TestLog *this_04;
  Pipeline *this_05;
  SeparateShaderTest *pSVar9;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  ProgramWrapper *in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e0;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_b10;
  undefined1 *local_b08;
  deUint32 local_948;
  deUint32 local_930;
  DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline> local_8fa;
  undefined1 local_8f9;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_8f8;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_8e8;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_8d8;
  MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> local_8c8;
  ProgramWrapper *local_8b8;
  ProgramWrapper *frgStage;
  ProgramWrapper *vtxStage;
  string local_8a0;
  uint local_880;
  deUint32 local_87c;
  MessageBuilder local_878;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_6f8;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_6e8;
  undefined1 local_6d8 [8];
  string newSource_1;
  MessageBuilder local_6b0;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_530;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_520;
  undefined1 local_510 [8];
  string newSource;
  string local_4e8;
  uint local_4c4;
  uint local_4c0;
  deUint32 local_4bc;
  MessageBuilder local_4b8;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_338;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_328;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_318;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_308;
  undefined1 local_2f8 [8];
  string vtxSource_1;
  MessageBuilder local_2d0;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_150;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_140;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> local_130;
  undefined1 local_118 [8];
  string vtxSource;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  frgProg;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  vtxProg;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  fullProg;
  undefined1 local_c0 [8];
  MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> pipeline;
  RenderContext *renderCtx;
  string frgSource;
  deUint32 initFrgSeed;
  string frgName;
  deUint32 initVtxSeed;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string vtxName;
  bool useUniform;
  ProgramParams *pp_local;
  SeparateShaderTest *this_local;
  
  vtxName.field_2._M_local_buf[0xf] = (this->m_params).useUniform & 1;
  pcVar5 = "vtxScale";
  if (((this->m_params).useSameName & 1U) != 0) {
    pcVar5 = "scale";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,pcVar5,&local_49);
  std::allocator<char>::~allocator(&local_49);
  if (((this->m_params).switchVtx & 1U) == 0) {
    local_930 = pp->vtxSeed;
  }
  else {
    local_930 = de::Random::getUint32(&this->m_rnd);
  }
  frgName.field_2._8_4_ = local_930;
  pcVar5 = "frgScale";
  if (((this->m_params).useSameName & 1U) != 0) {
    pcVar5 = "scale";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&initFrgSeed,pcVar5,(allocator<char> *)(frgSource.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(frgSource.field_2._M_local_buf + 0xf));
  if (((this->m_params).switchFrg & 1U) == 0) {
    local_948 = pp->frgSeed;
  }
  else {
    local_948 = de::Random::getUint32(&this->m_rnd);
  }
  frgSource.field_2._8_4_ = local_948;
  genFrgShaderSrc((string *)&renderCtx,local_948,&(this->m_varyings).frgInputs,
                  (string *)&initFrgSeed,(bool)(vtxName.field_2._M_local_buf[0xf] & 1),pp->frgScale)
  ;
  pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.m_data.
  _8_8_ = getRenderContext(this);
  pPVar6 = (ProgramPipeline *)operator_new(0x10);
  glu::ProgramPipeline::ProgramPipeline
            (pPVar6,(RenderContext *)
                    pipeline.
                    super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                    .m_data._8_8_);
  de::DefaultDeleter<glu::ProgramPipeline>::DefaultDeleter
            ((DefaultDeleter<glu::ProgramPipeline> *)
             &fullProg.
              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              .m_data.field_0xf);
  de::details::MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::MovePtr
            ((MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *)local_c0,
             pPVar6);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             *)&vtxProg.
                super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             *)&frgProg.
                super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             *)((long)&vtxSource.field_2 + 8));
  seed = frgName.field_2._8_4_;
  if (((this->m_params).initSingle & 1U) == 0) {
    genVtxShaderSrc((string *)local_2f8,frgName.field_2._8_4_,&(this->m_varyings).vtxOutputs,
                    (string *)local_48,(bool)(vtxName.field_2._M_local_buf[0xf] & 1),pp->vtxScale);
    pSVar9 = this;
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_318,this,SHADERTYPE_VERTEX,(string *)local_2f8);
    local_308 = de::details::MovePtr::operator_cast_to_PtrData(&local_318,(MovePtr *)pSVar9);
    data_00._8_8_ = in_stack_fffffffffffff4e0;
    data_00.ptr = in_stack_fffffffffffff4d8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)&frgProg.
                    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                    .m_data.field_0x8,data_00);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_318);
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)&frgProg.
                              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                              .m_data.field_0x8);
    dVar4 = (*pPVar7->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar6,1,dVar4);
    pSVar9 = this;
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_338,this,SHADERTYPE_FRAGMENT,(string *)&renderCtx);
    local_328 = de::details::MovePtr::operator_cast_to_PtrData(&local_338,(MovePtr *)pSVar9);
    data_01._8_8_ = in_stack_fffffffffffff4e0;
    data_01.ptr = in_stack_fffffffffffff4d8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)((long)&vtxSource.field_2 + 8),data_01);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_338);
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)((long)&vtxSource.field_2 + 8));
    dVar4 = (*pPVar7->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar6,2,dVar4);
    log(this,__x_00);
    tcu::TestLog::operator<<(&local_4b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_4b8,(char (*) [21])"// Created pipeline ");
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    local_4bc = glu::ProgramPipeline::getPipeline(pPVar6);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4bc);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [22])" with vertex program ");
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)&frgProg.
                              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                              .m_data.field_0x8);
    local_4c0 = (*pPVar7->_vptr_ProgramWrapper[2])();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4c0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])" and fragment program ");
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)((long)&vtxSource.field_2 + 8));
    local_4c4 = (*pPVar7->_vptr_ProgramWrapper[2])();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4c4);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
    std::__cxx11::string::~string((string *)local_2f8);
  }
  else {
    varyingCompatVtxOutputs(&local_130,&this->m_varyings);
    genVtxShaderSrc((string *)local_118,seed,&local_130,(string *)local_48,
                    (bool)(vtxName.field_2._M_local_buf[0xf] & 1),pp->vtxScale);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
              (&local_130);
    pSVar9 = this;
    createShaderProgram((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)&local_150,this,(string *)local_118,(string *)&renderCtx,true);
    local_140 = de::details::MovePtr::operator_cast_to_PtrData(&local_150,(MovePtr *)pSVar9);
    data._8_8_ = in_stack_fffffffffffff4e0;
    data.ptr = in_stack_fffffffffffff4d8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)&vtxProg.
                    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                    .m_data.field_0x8,data);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_150);
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)&vtxProg.
                              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                              .m_data.field_0x8);
    dVar4 = (*pPVar7->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar6,3,dVar4);
    log(this,__x);
    tcu::TestLog::operator<<(&local_2d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [21])"// Created pipeline ");
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    vtxSource_1.field_2._12_4_ = glu::ProgramPipeline::getPipeline(pPVar6);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(uint *)(vtxSource_1.field_2._M_local_buf + 0xc));
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [26])" with two-shader program ");
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)&vtxProg.
                              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                              .m_data.field_0x8);
    vtxSource_1.field_2._8_4_ = (*pPVar7->_vptr_ProgramWrapper[2])();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)(vtxSource_1.field_2._M_local_buf + 8));
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2d0);
    std::__cxx11::string::~string((string *)local_118);
  }
  pPVar6 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
           ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
  bVar3 = glu::ProgramPipeline::isValid(pPVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"Pipeline is invalid after initialization",
             (allocator<char> *)(newSource.field_2._M_local_buf + 0xf));
  tcu::ResultCollector::check(&this->m_status,bVar3,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  __x_01 = (double)std::allocator<char>::~allocator
                             ((allocator<char> *)(newSource.field_2._M_local_buf + 0xf));
  if (((this->m_params).switchVtx & 1U) != 0) {
    genVtxShaderSrc((string *)local_510,pp->vtxSeed,&(this->m_varyings).vtxOutputs,
                    (string *)local_48,(bool)(vtxName.field_2._M_local_buf[0xf] & 1),pp->vtxScale);
    pSVar9 = this;
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_530,this,SHADERTYPE_VERTEX,(string *)local_510);
    local_520 = de::details::MovePtr::operator_cast_to_PtrData(&local_530,(MovePtr *)pSVar9);
    data_02._8_8_ = in_stack_fffffffffffff4e0;
    data_02.ptr = in_stack_fffffffffffff4d8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)&frgProg.
                    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                    .m_data.field_0x8,data_02);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_530);
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)&frgProg.
                              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                              .m_data.field_0x8);
    dVar4 = (*pPVar7->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar6,1,dVar4);
    log(this,__x_02);
    tcu::TestLog::operator<<(&local_6b0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_6b0,(char (*) [22])"// Switched pipeline ");
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    newSource_1.field_2._12_4_ = glu::ProgramPipeline::getPipeline(pPVar6);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(uint *)(newSource_1.field_2._M_local_buf + 0xc));
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(char (*) [42])"\'s vertex stage to single-shader program ");
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)&frgProg.
                              super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                              .m_data.field_0x8);
    newSource_1.field_2._8_4_ = (*pPVar7->_vptr_ProgramWrapper[2])();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)(newSource_1.field_2._M_local_buf + 8));
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6b0);
    __x_01 = (double)std::__cxx11::string::~string((string *)local_510);
  }
  if (((this->m_params).switchFrg & 1U) != 0) {
    genFrgShaderSrc((string *)local_6d8,pp->frgSeed,&(this->m_varyings).frgInputs,
                    (string *)&initFrgSeed,(bool)(vtxName.field_2._M_local_buf[0xf] & 1),
                    pp->frgScale);
    pSVar9 = this;
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_6f8,this,SHADERTYPE_FRAGMENT,(string *)local_6d8);
    local_6e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_6f8,(MovePtr *)pSVar9);
    data_03._8_8_ = in_stack_fffffffffffff4e0;
    data_03.ptr = in_stack_fffffffffffff4d8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)((long)&vtxSource.field_2 + 8),data_03);
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)&local_6f8);
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)((long)&vtxSource.field_2 + 8));
    dVar4 = (*pPVar7->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar6,2,dVar4);
    log(this,__x_03);
    tcu::TestLog::operator<<(&local_878,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_878,(char (*) [22])"// Switched pipeline ");
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    local_87c = glu::ProgramPipeline::getPipeline(pPVar6);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_87c);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(char (*) [44])"\'s fragment stage to single-shader program ");
    pPVar7 = de::details::
             UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             ::operator->((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                           *)((long)&vtxSource.field_2 + 8));
    local_880 = (*pPVar7->_vptr_ProgramWrapper[2])();
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_880);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_878);
    __x_01 = (double)std::__cxx11::string::~string((string *)local_6d8);
  }
  if ((((this->m_params).switchVtx & 1U) != 0) || (((this->m_params).switchFrg & 1U) != 0)) {
    pPVar6 = de::details::
             UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::operator->
                       ((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         *)local_c0);
    bVar3 = glu::ProgramPipeline::isValid(pPVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"Pipeline became invalid after changing a stage\'s program",
               (allocator<char> *)((long)&vtxStage + 7));
    tcu::ResultCollector::check(&this->m_status,bVar3,&local_8a0);
    std::__cxx11::string::~string((string *)&local_8a0);
    __x_01 = (double)std::allocator<char>::~allocator((allocator<char> *)((long)&vtxStage + 7));
  }
  if (((this->m_params).useUniform & 1U) == 0) {
    log(this,__x_01);
    tcu::TestLog::writeMessage(this_04,"// Programs use constants instead of uniforms");
  }
  else {
    bVar3 = de::details::UniqueBase::operator_cast_to_bool
                      ((UniqueBase *)
                       &frgProg.
                        super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                        .m_data.field_0x8);
    if (bVar3) {
      pMVar1 = &frgProg;
    }
    else {
      pMVar1 = &vtxProg;
    }
    local_b08 = &(pMVar1->
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 ).m_data.field_0x8;
    frgStage = de::details::
               UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               ::operator*((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                            *)local_b08);
    bVar3 = de::details::UniqueBase::operator_cast_to_bool
                      ((UniqueBase *)(vtxSource.field_2._M_local_buf + 8));
    if (bVar3) {
      paVar2 = &vtxSource.field_2;
    }
    else {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                *)&vtxProg.
                   super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
      ;
    }
    local_b10 = (UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 *)((long)paVar2 + 8);
    local_8b8 = de::details::
                UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                ::operator*(local_b10);
    setUniform(this,frgStage,(string *)local_48,pp->vtxScale,
               (bool)((this->m_params).useProgramUniform & 1));
    setUniform(this,local_8b8,(string *)&initFrgSeed,pp->frgScale,
               (bool)((this->m_params).useProgramUniform & 1));
  }
  this_05 = (Pipeline *)operator_new(0x40);
  local_8f9 = 1;
  de::details::MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::MovePtr
            (&local_8c8,
             (MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *)local_c0);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(&local_8d8,
            (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             *)&vtxProg.
                super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(&local_8e8,
            (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             *)&frgProg.
                super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(&local_8f8,
            (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             *)((long)&vtxSource.field_2 + 8));
  Pipeline::Pipeline(this_05,&local_8c8,&local_8d8,&local_8e8,&local_8f8);
  local_8f9 = 0;
  de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>::DefaultDeleter
            (&local_8fa);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::MovePtr(__return_storage_ptr__,this_05);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr(&local_8f8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr(&local_8e8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr(&local_8d8);
  de::details::MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::~MovePtr
            (&local_8c8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)((long)&vtxSource.field_2 + 8));
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)&frgProg.
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 .m_data.field_0x8);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)&vtxProg.
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                 .m_data.field_0x8);
  de::details::MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::~MovePtr
            ((MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> *)local_c0);
  std::__cxx11::string::~string((string *)&renderCtx);
  std::__cxx11::string::~string((string *)&initFrgSeed);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Pipeline> SeparateShaderTest::createPipeline (const ProgramParams& pp)
{
	const bool		useUniform	= m_params.useUniform;
	const string	vtxName		= m_params.useSameName ? "scale" : "vtxScale";
	const deUint32	initVtxSeed	= m_params.switchVtx ? m_rnd.getUint32() : pp.vtxSeed;

	const string	frgName		= m_params.useSameName ? "scale" : "frgScale";
	const deUint32	initFrgSeed	= m_params.switchFrg ? m_rnd.getUint32() : pp.frgSeed;
	const string	frgSource	= genFrgShaderSrc(initFrgSeed, m_varyings.frgInputs,
												  frgName, useUniform, pp.frgScale);

	const RenderContext&		renderCtx	= getRenderContext();
	MovePtr<ProgramPipeline>	pipeline	(new ProgramPipeline(renderCtx));
	MovePtr<ProgramWrapper>		fullProg;
	MovePtr<ProgramWrapper>		vtxProg;
	MovePtr<ProgramWrapper>		frgProg;

	// We cannot allow a situation where we have a single program with a
	// single uniform, because then the vertex and fragment shader uniforms
	// would not be distinct in the final pipeline, and we are going to test
	// that altering one uniform will not affect the other.
	DE_ASSERT(!(m_params.initSingle	&& m_params.useSameName &&
				!m_params.switchVtx && !m_params.switchFrg));

	if (m_params.initSingle)
	{
		string vtxSource = genVtxShaderSrc(initVtxSeed,
										   varyingCompatVtxOutputs(m_varyings),
										   vtxName, useUniform, pp.vtxScale);
		fullProg = createShaderProgram(&vtxSource, &frgSource, true);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT,
								   fullProg->getProgramName());
		log() << TestLog::Message
			  << "// Created pipeline " << pipeline->getPipeline()
			  << " with two-shader program " << fullProg->getProgramName()
			  << TestLog::EndMessage;
	}
	else
	{
		string vtxSource = genVtxShaderSrc(initVtxSeed, m_varyings.vtxOutputs,
										   vtxName, useUniform, pp.vtxScale);
		vtxProg = createSingleShaderProgram(glu::SHADERTYPE_VERTEX, vtxSource);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT, vtxProg->getProgramName());

		frgProg = createSingleShaderProgram(glu::SHADERTYPE_FRAGMENT, frgSource);
		pipeline->useProgramStages(GL_FRAGMENT_SHADER_BIT, frgProg->getProgramName());

		log() << TestLog::Message
			  << "// Created pipeline " << pipeline->getPipeline()
			  << " with vertex program " << vtxProg->getProgramName()
			  << " and fragment program " << frgProg->getProgramName()
			  << TestLog::EndMessage;
	}

	m_status.check(pipeline->isValid(),
				   "Pipeline is invalid after initialization");

	if (m_params.switchVtx)
	{
		string newSource = genVtxShaderSrc(pp.vtxSeed, m_varyings.vtxOutputs,
										   vtxName, useUniform, pp.vtxScale);
		vtxProg = createSingleShaderProgram(glu::SHADERTYPE_VERTEX, newSource);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT, vtxProg->getProgramName());
		log() << TestLog::Message
			  << "// Switched pipeline " << pipeline->getPipeline()
			  << "'s vertex stage to single-shader program " << vtxProg->getProgramName()
			  << TestLog::EndMessage;
	}
	if (m_params.switchFrg)
	{
		string newSource = genFrgShaderSrc(pp.frgSeed, m_varyings.frgInputs,
										   frgName, useUniform, pp.frgScale);
		frgProg = createSingleShaderProgram(glu::SHADERTYPE_FRAGMENT, newSource);
		pipeline->useProgramStages(GL_FRAGMENT_SHADER_BIT, frgProg->getProgramName());
		log() << TestLog::Message
			  << "// Switched pipeline " << pipeline->getPipeline()
			  << "'s fragment stage to single-shader program " << frgProg->getProgramName()
			  << TestLog::EndMessage;
	}

	if (m_params.switchVtx || m_params.switchFrg)
		m_status.check(pipeline->isValid(),
					   "Pipeline became invalid after changing a stage's program");

	if (m_params.useUniform)
	{
		ProgramWrapper& vtxStage = *(vtxProg ? vtxProg : fullProg);
		ProgramWrapper& frgStage = *(frgProg ? frgProg : fullProg);

		setUniform(vtxStage, vtxName, pp.vtxScale, m_params.useProgramUniform);
		setUniform(frgStage, frgName, pp.frgScale, m_params.useProgramUniform);
	}
	else
		log().writeMessage("// Programs use constants instead of uniforms");

	return MovePtr<Pipeline>(new Pipeline(pipeline, fullProg, vtxProg, frgProg));
}